

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeLoop
          (InstructionCreater *this,Node *node,Element *refelt)

{
  pointer ppIVar1;
  pointer ppIVar2;
  InstructionData *instdata;
  size_t i;
  size_t local_38;
  
  local_38 = node->index;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&(this->LoopBreakIDs).c,&local_38);
  ppIVar1 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar2 = (this->InstList).
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            .
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  createReferNode(this,(node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  instdata = (InstructionData *)operator_new(0x18);
  instdata[1]._vptr_InstructionData = (_func_int **)0x0;
  instdata->_vptr_InstructionData = (_func_int **)0x0;
  *(undefined8 *)&instdata->Inst = 0;
  instdata->Inst = jump;
  instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00161d60;
  Instruction::InstructionList::push(&this->InstList,instdata);
  instdata[1]._vptr_InstructionData = (_func_int **)((long)ppIVar1 - (long)ppIVar2 >> 3);
  Instruction::InstructionList::push(&this->InstList,nop);
  ASTBase::Element::setRefer
            (refelt,((long)(this->InstList).
                           super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                           .
                           super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->InstList).
                           super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                           .
                           super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  i = ASTBase::Element::getRefer(refelt);
  adjustLoopBreakJump(this,i);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->LoopBreakIDs).c);
  return true;
}

Assistant:

bool createNodeLoop(Node &node, Element &refelt) {
				LoopBreakIDs.push(node.getIndex());
				Element &Rdo = node[1];
				size_t index = NextInstID();
				createReferNode(Rdo);
				auto *jpinst = new Insts::Jump();
				InstList.push(jpinst);
				jpinst->Index = index;
				InstList.push(nop);

				refelt.setRefer(CurrInstID());
				adjustLoopBreakJump(refelt.getRefer());
				LoopBreakIDs.pop();
				return true;
			}